

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone_partitioning.cc
# Opt level: O0

void __thiscall
PolygonTriangulation::add_vertex_to_monochain
          (PolygonTriangulation *this,Trapezoid_t *trapezoid,bool go_down,Monochain_t *monochain)

{
  uint32_t local_30;
  uint32_t local_2c;
  Monochain_t *pMStack_28;
  uint32_t vertex_index;
  Monochain_t *monochain_local;
  Trapezoid_t *pTStack_18;
  bool go_down_local;
  Trapezoid_t *trapezoid_local;
  PolygonTriangulation *this_local;
  
  if (go_down) {
    local_30 = trapezoid->min_y;
  }
  else {
    local_30 = trapezoid->max_y;
  }
  local_2c = local_30;
  pMStack_28 = monochain;
  monochain_local._7_1_ = go_down;
  pTStack_18 = trapezoid;
  trapezoid_local = (Trapezoid_t *)this;
  if ((monochain->insertion_side == InsertRight) == go_down) {
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&monochain->list,&local_2c);
  }
  else {
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_front
              (&monochain->list,&local_2c);
  }
  return;
}

Assistant:

void PolygonTriangulation::add_vertex_to_monochain(
    const Trapezoid_t &trapezoid,
    const bool go_down,
    Monochain_t *monochain
) {
  /// * Insertion order depends on the side :
  /// When is left : up pushed back, down pushed front
  /// When is right : down pushed back, up pushed front

  const auto vertex_index = (go_down) ? trapezoid.min_y : trapezoid.max_y;

  /// To insert vertices in direct order we look for the direction.
  if ((InsertRight == monochain->insertion_side) == go_down) {
    monochain->list.push_back(vertex_index);
  } else {
    monochain->list.push_front(vertex_index);
  }
}